

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsocks5socketengine.cpp
# Opt level: O0

ssize_t __thiscall
QSocks5SocketEngine::read(QSocks5SocketEngine *this,int __fd,void *__buf,size_t __nbytes)

{
  long lVar1;
  QLatin1StringView latin1;
  bool bVar2;
  SocketState SVar3;
  QSocks5SocketEnginePrivate *pQVar4;
  undefined4 in_register_00000034;
  QFlags<QAbstractSocketEngine::PacketHeaderOption> *this_00;
  long in_FS_OFFSET;
  qint64 copy;
  QSocks5SocketEnginePrivate *d;
  undefined8 in_stack_ffffffffffffff78;
  SocketState state;
  QString *in_stack_ffffffffffffff80;
  char *in_stack_ffffffffffffff88;
  SocketError error;
  ssize_t local_30;
  undefined4 local_24;
  
  state = (SocketState)((ulong)in_stack_ffffffffffffff78 >> 0x20);
  this_00 = (QFlags<QAbstractSocketEngine::PacketHeaderOption> *)CONCAT44(in_register_00000034,__fd)
  ;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = d_func((QSocks5SocketEngine *)0x373dca);
  if (pQVar4->mode == ConnectMode) {
    bVar2 = QRingBuffer::isEmpty(&pQVar4->connectData->readBuffer);
    if (bVar2) {
      SVar3 = QAbstractSocket::state((QAbstractSocket *)0x373e13);
      if (SVar3 == UnconnectedState) {
        (**(code **)(*(long *)this + 0xa8))();
        Qt::Literals::StringLiterals::operator____L1
                  (in_stack_ffffffffffffff88,(size_t)in_stack_ffffffffffffff80);
        error = (SocketError)((ulong)in_stack_ffffffffffffff88 >> 0x20);
        latin1.m_data = (char *)__buf;
        latin1.m_size = (qsizetype)pQVar4;
        QString::QString((QString *)this,latin1);
        QAbstractSocketEngine::setError
                  ((QAbstractSocketEngine *)this,error,in_stack_ffffffffffffff80);
        QString::~QString((QString *)0x373e73);
        QAbstractSocketEngine::setState((QAbstractSocketEngine *)in_stack_ffffffffffffff80,state);
        local_30 = -1;
      }
      else {
        local_30 = 0;
      }
    }
    else {
      local_30 = QRingBuffer::read((char *)&pQVar4->connectData->readBuffer,(longlong)this_00);
    }
  }
  else if (pQVar4->mode == UdpAssociateMode) {
    QFlags<QAbstractSocketEngine::PacketHeaderOption>::QFlags(this_00,state);
    local_30 = (**(code **)(*(long *)this + 0xf8))(this,this_00,__buf,0,local_24);
  }
  else {
    local_30 = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_30;
  }
  __stack_chk_fail();
}

Assistant:

qint64 QSocks5SocketEngine::read(char *data, qint64 maxlen)
{
    Q_D(QSocks5SocketEngine);
    QSOCKS5_Q_DEBUG << "read( , maxlen = " << maxlen << ')';
    if (d->mode == QSocks5SocketEnginePrivate::ConnectMode) {
        if (d->connectData->readBuffer.isEmpty()) {
            if (d->data->controlSocket->state() == QAbstractSocket::UnconnectedState) {
                //imitate remote closed
                close();
                setError(QAbstractSocket::RemoteHostClosedError,
                         "Remote host closed connection"_L1);
                setState(QAbstractSocket::UnconnectedState);
                return -1;
            } else {
                return 0;       // nothing to be read
            }
        }
        const qint64 copy = d->connectData->readBuffer.read(data, maxlen);
        QSOCKS5_DEBUG << "read" << dump(QByteArray(data, copy));
        return copy;
#ifndef QT_NO_UDPSOCKET
    } else if (d->mode == QSocks5SocketEnginePrivate::UdpAssociateMode) {
        return readDatagram(data, maxlen);
#endif
    }
    return 0;
}